

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollbar.cpp
# Opt level: O0

void __thiscall QScrollBarPrivate::flash(QScrollBarPrivate *this)

{
  bool bVar1;
  int iVar2;
  QScrollBar *pQVar3;
  QStyle *pQVar4;
  Duration in_RDI;
  long in_FS_OFFSET;
  QScrollBar *q;
  QStyleOptionSlider opt;
  QWidget *in_stack_ffffffffffffff48;
  QWidget *in_stack_ffffffffffffff60;
  undefined1 local_88 [128];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = q_func((QScrollBarPrivate *)in_RDI.__r);
  memcpy(local_88,&DAT_00b22040,0x80);
  QStyleOptionSlider::QStyleOptionSlider((QStyleOptionSlider *)0x67b185);
  (**(code **)(*(long *)&(pQVar3->super_QAbstractSlider).super_QWidget + 0x1a8))(pQVar3,local_88);
  if ((((QScrollBarPrivate *)in_RDI.__r)->flashed & 1U) == 0) {
    pQVar4 = QWidget::style(in_stack_ffffffffffffff48);
    iVar2 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x60,local_88,pQVar3,0);
    if (iVar2 != 0) {
      ((QScrollBarPrivate *)in_RDI.__r)->flashed = true;
      bVar1 = QWidget::isVisible((QWidget *)0x67b1e9);
      if (bVar1) {
        QWidget::update(in_stack_ffffffffffffff48);
      }
      else {
        QWidget::show(in_stack_ffffffffffffff60);
      }
    }
  }
  bVar1 = QBasicTimer::isActive(&((QScrollBarPrivate *)in_RDI.__r)->flashTimer);
  if (!bVar1) {
    ns<(char)48>();
    QBasicTimer::start((QBasicTimer *)in_stack_ffffffffffffff48,in_RDI,(QObject *)0x67b248);
  }
  QStyleOptionSlider::~QStyleOptionSlider((QStyleOptionSlider *)0x67b252);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QScrollBarPrivate::flash()
{
    Q_Q(QScrollBar);
    QStyleOptionSlider opt;
    q->initStyleOption(&opt);
    if (!flashed && q->style()->styleHint(QStyle::SH_ScrollBar_Transient, &opt, q)) {
        flashed = true;
        if (!q->isVisible())
            q->show();
        else
            q->update();
    }
    if (!flashTimer.isActive())
        flashTimer.start(0ns, q);
}